

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj-curse.c
# Opt level: O0

_Bool curses_conflict(wchar_t first,wchar_t second)

{
  curse *pcVar1;
  char *pcVar2;
  char local_78 [8];
  char buf [80];
  curse *c;
  wchar_t second_local;
  wchar_t first_local;
  
  pcVar1 = curses;
  memset(local_78,0,0x50);
  local_78[0] = '|';
  if (pcVar1[first].conflict == (char *)0x0) {
    second_local._3_1_ = false;
  }
  else {
    my_strcat(local_78,curses[second].name,0x50);
    my_strcat(local_78,"|",0x50);
    pcVar2 = strstr(pcVar1[first].conflict,local_78);
    if (pcVar2 == (char *)0x0) {
      second_local._3_1_ = false;
    }
    else {
      second_local._3_1_ = true;
    }
  }
  return second_local._3_1_;
}

Assistant:

static bool curses_conflict(int first, int second)
{
	struct curse *c = &curses[first];
	char buf[80] = "|";

	/* First curse has no conflicts */
	if (!c->conflict) {
		return false;
	}

	/* Build the conflict strong and search for it */
	my_strcat(buf, curses[second].name, sizeof(buf));
	my_strcat(buf, "|", sizeof(buf));
	if (strstr(c->conflict, buf)) {
		return true;
	}

	return false;
}